

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

void __thiscall
duckdb::StandardBufferManager::StandardBufferManager
          (StandardBufferManager *this,DatabaseInstance *db,string *tmp)

{
  _Head_base<0UL,_duckdb::BlockManager_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BlockManager_*,_false> _Var2;
  idx_t i;
  BufferPool *pBVar3;
  long lVar4;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::BlockManager_*,_false> local_48;
  _Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false> local_40;
  unsigned_long_long local_38 [2];
  
  (this->super_BufferManager)._vptr_BufferManager =
       (_func_int **)&PTR__StandardBufferManager_027c34d8;
  this->db = db;
  pBVar3 = DatabaseInstance::GetBufferPool(db);
  this->buffer_pool = pBVar3;
  (this->temporary_directory).path._M_dataplus._M_p =
       (pointer)&(this->temporary_directory).path.field_2;
  (this->temporary_directory).path._M_string_length = 0;
  (this->temporary_directory).path.field_2._M_local_buf[0] = '\0';
  (this->temporary_directory).lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->temporary_directory).lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->temporary_directory).lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->temporary_directory).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->temporary_directory).handle.
  super_unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TemporaryDirectoryHandle_*,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
  .super__Head_base<0UL,_duckdb::TemporaryDirectoryHandle_*,_false>._M_head_impl =
       (TemporaryDirectoryHandle *)0x0;
  (this->temporary_directory).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->temporary_directory).size_on_disk.super___atomic_base<unsigned_long>._M_i = 0;
  (this->temporary_directory).maximum_swap_space.index = 0xffffffffffffffff;
  (this->temporary_id).super___atomic_base<long>._M_i = 0x4000000000000060;
  make_uniq<duckdb::BufferAllocatorData,duckdb::StandardBufferManager&>((duckdb *)&local_48,this);
  local_40._M_head_impl = (PrivateAllocatorData *)local_48;
  local_48._M_head_impl = (BlockManager *)0x0;
  Allocator::Allocator
            (&this->buffer_allocator,BufferAllocatorAllocate,BufferAllocatorFree,
             BufferAllocatorRealloc,
             (unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>,_true>
              *)&local_40);
  if (local_40._M_head_impl != (PrivateAllocatorData *)0x0) {
    (*(local_40._M_head_impl)->_vptr_PrivateAllocatorData[1])();
  }
  local_40._M_head_impl = (PrivateAllocatorData *)0x0;
  if (local_48._M_head_impl != (BlockManager *)0x0) {
    (*(local_48._M_head_impl)->_vptr_BlockManager[1])();
  }
  (this->temp_block_manager).
  super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
  super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = (BlockManager *)0x0;
  local_38[1] = 0x40000;
  local_38[0] = 8;
  make_uniq<duckdb::InMemoryBlockManager,duckdb::StandardBufferManager&,unsigned_long_long,unsigned_long_long>
            ((duckdb *)&local_48,this,local_38 + 1,local_38);
  _Var2._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (BlockManager *)0x0;
  _Var1._M_head_impl =
       (this->temp_block_manager).
       super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
       super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
       super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl;
  (this->temp_block_manager).
  super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
  super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (BlockManager *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_BlockManager + 8))();
    if (local_48._M_head_impl != (BlockManager *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  ::std::__cxx11::string::operator=((string *)&this->temporary_directory,(string *)tmp);
  for (lVar4 = 0; lVar4 != 0xe; lVar4 = lVar4 + 1) {
    LOCK();
    this->evicted_data_per_tag[lVar4].super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
  }
  return;
}

Assistant:

StandardBufferManager::StandardBufferManager(DatabaseInstance &db, string tmp)
    : BufferManager(), db(db), buffer_pool(db.GetBufferPool()), temporary_id(MAXIMUM_BLOCK),
      buffer_allocator(BufferAllocatorAllocate, BufferAllocatorFree, BufferAllocatorRealloc,
                       make_uniq<BufferAllocatorData>(*this)) {
	temp_block_manager =
	    make_uniq<InMemoryBlockManager>(*this, DEFAULT_BLOCK_ALLOC_SIZE, DEFAULT_BLOCK_HEADER_STORAGE_SIZE);
	temporary_directory.path = std::move(tmp);
	for (idx_t i = 0; i < MEMORY_TAG_COUNT; i++) {
		evicted_data_per_tag[i] = 0;
	}
}